

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  float *output;
  stbi_uc *psVar11;
  ushort uVar12;
  long lVar13;
  int c;
  uint uVar14;
  uint a;
  int iVar15;
  float *output_00;
  stbi_uc *psVar16;
  long *in_FS_OFFSET;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  char *local_640;
  ulong local_638;
  float *local_630;
  stbi_uc *local_628;
  long local_620;
  ulong local_618;
  ulong local_610;
  long local_608;
  ulong local_600;
  long local_5f8;
  stbi_uc local_5f0;
  stbi_uc local_5ef;
  stbi_uc local_5ee;
  stbi_uc local_5ed;
  stbi_uc local_5ec [4];
  stbi_uc *local_5e8;
  undefined8 uStack_5e0;
  undefined4 local_5d8;
  char *local_5d0;
  char *pcStack_5c8;
  undefined8 local_5c0;
  stbi_uc *local_5b8;
  undefined8 uStack_5b0;
  undefined4 local_5a8;
  char *local_5a0;
  char *pcStack_598;
  undefined8 local_590;
  float *local_588;
  undefined8 uStack_580;
  undefined4 local_578;
  char *local_570;
  char *pcStack_568;
  undefined8 local_560;
  stbi_uc *local_558;
  undefined8 uStack_550;
  undefined4 local_548;
  char *local_540;
  char *pcStack_538;
  undefined8 local_530;
  float *local_528;
  undefined8 uStack_520;
  undefined4 local_518;
  char *local_510;
  char *pcStack_508;
  undefined8 local_500;
  float *local_4f8;
  undefined8 uStack_4f0;
  undefined4 local_4e8;
  char *local_4e0;
  char *pcStack_4d8;
  undefined8 local_4d0;
  stbi_uc *local_4c8;
  undefined8 uStack_4c0;
  undefined4 local_4b8;
  char *local_4b0;
  char *pcStack_4a8;
  undefined8 local_4a0;
  float *local_498;
  undefined8 uStack_490;
  undefined4 local_488;
  char *local_480;
  char *pcStack_478;
  undefined8 local_470;
  stbi_uc *local_468;
  undefined8 uStack_460;
  undefined4 local_458;
  char *local_450;
  char *pcStack_448;
  undefined8 local_440;
  char local_438;
  char cStack_437;
  byte bStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  iVar15 = req_comp;
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(bStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) ==
       0x4e41494441523f23) ||
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) == 0x454247 &&
      CONCAT13(cStack_435,CONCAT12(bStack_436,CONCAT11(cStack_437,local_438))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      local_638 = CONCAT44(local_638._4_4_,req_comp);
      bVar1 = false;
      do {
        auVar17[0] = -(cStack_431 == '3');
        auVar17[1] = -(cStack_430 == '2');
        auVar17[2] = -(cStack_42f == '-');
        auVar17[3] = -(cStack_42e == 'b');
        auVar17[4] = -(cStack_42d == 'i');
        auVar17[5] = -(cStack_42c == 't');
        auVar17[6] = -(cStack_42b == '_');
        auVar17[7] = -(cStack_42a == 'r');
        auVar17[8] = -(cStack_429 == 'l');
        auVar17[9] = -(cStack_428 == 'e');
        auVar17[10] = -(cStack_427 == '_');
        auVar17[0xb] = -(cStack_426 == 'r');
        auVar17[0xc] = -(cStack_425 == 'g');
        auVar17[0xd] = -(cStack_424 == 'b');
        auVar17[0xe] = -(cStack_423 == 'e');
        auVar17[0xf] = -(cStack_422 == '\0');
        auVar18[0] = -(local_438 == 'F');
        auVar18[1] = -(cStack_437 == 'O');
        auVar18[2] = -(bStack_436 == 0x52);
        auVar18[3] = -(cStack_435 == 'M');
        auVar18[4] = -(cStack_434 == 'A');
        auVar18[5] = -(cStack_433 == 'T');
        auVar18[6] = -(cStack_432 == '=');
        auVar18[7] = -(cStack_431 == '3');
        auVar18[8] = -(cStack_430 == '2');
        auVar18[9] = -(cStack_42f == '-');
        auVar18[10] = -(cStack_42e == 'b');
        auVar18[0xb] = -(cStack_42d == 'i');
        auVar18[0xc] = -(cStack_42c == 't');
        auVar18[0xd] = -(cStack_42b == '_');
        auVar18[0xe] = -(cStack_42a == 'r');
        auVar18[0xf] = -(cStack_429 == 'l');
        auVar18 = auVar18 & auVar17;
        if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar1) {
        local_640 = &local_438;
        stbi__hdr_gettoken(s,&local_438);
        uVar12 = bStack_436 ^ 0x20 | CONCAT11(cStack_437,local_438) ^ 0x592d;
        uVar14 = (uint)uVar12;
        if (uVar12 == 0) {
          local_640 = &cStack_435;
          uVar9 = strtol(local_640,&local_640,10);
          local_640 = local_640 + -1;
          do {
            pcVar8 = local_640;
            local_640 = pcVar8 + 1;
          } while (pcVar8[1] == ' ');
          iVar6 = strncmp(local_640,"+X ",3);
          if (iVar6 == 0) {
            local_640 = pcVar8 + 4;
            uVar10 = strtol(local_640,(char **)0x0,10);
            iVar6 = (int)uVar9;
            if ((iVar6 < 0x1000001) && (a = (uint)uVar10, (int)a < 0x1000001)) {
              *x = a;
              *y = iVar6;
              if (comp != (int *)0x0) {
                *comp = 3;
              }
              c = 3;
              if ((int)local_638 != 0) {
                c = (int)local_638;
              }
              iVar7 = stbi__mad4sizes_valid(a,iVar6,c,uVar14,iVar15);
              if (iVar7 != 0) {
                output = (float *)stbi__malloc_mad4(a,iVar6,c,uVar14,iVar15);
                if (output != (float *)0x0) {
                  iVar15 = 0;
                  local_638 = uVar9;
                  if (a - 0x8000 < 0xffff8008) goto LAB_0016097f;
                  if (iVar6 < 1) {
                    psVar11 = (stbi_uc *)0x0;
                  }
                  else {
                    local_610 = uVar9 & 0x7fffffff;
                    local_618 = uVar10 & 0x7fffffff;
                    local_608 = (uVar10 & 0xffffffff) * (long)c * 4;
                    local_5f8 = (long)c << 2;
                    uVar9 = 0;
                    psVar11 = (stbi_uc *)0x0;
                    local_630 = output;
                    do {
                      local_600 = uVar9;
                      sVar2 = stbi__get8(s);
                      sVar3 = stbi__get8(s);
                      sVar4 = stbi__get8(s);
                      if (((sVar2 != '\x02') || (sVar3 != '\x02')) || ((char)sVar4 < '\0')) {
                        local_5f0 = sVar2;
                        local_5ef = sVar3;
                        local_5ee = sVar4;
                        local_5ed = stbi__get8(s);
                        stbi__hdr_convert(output,&local_5f0,c);
                        local_450 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                        ;
                        pcStack_448 = "stbi__hdr_load";
                        local_440 = 0x2aed;
                        uStack_460 = 0;
                        local_458 = 0;
                        local_468 = psVar11;
                        (*(code *)in_FS_OFFSET[-0x85])(*in_FS_OFFSET + -0x430,3);
                        iVar15 = 0;
                        iVar6 = 1;
                        do {
                          stbi__getn(s,local_5ec,4);
                          stbi__hdr_convert(output + (long)(int)(c * a * iVar15) + (long)(iVar6 * c)
                                            ,local_5ec,c);
                          iVar6 = iVar6 + 1;
                          while ((int)a <= iVar6) {
                            iVar15 = iVar15 + 1;
LAB_0016097f:
                            iVar6 = 0;
                            if ((int)local_638 <= iVar15) {
                              return output;
                            }
                          }
                        } while( true );
                      }
                      sVar2 = stbi__get8(s);
                      if (CONCAT11(sVar4,sVar2) != a) {
                        lVar13 = *in_FS_OFFSET;
                        local_480 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                        ;
                        pcStack_478 = "stbi__hdr_load";
                        local_470 = 0x2af2;
                        uStack_490 = 0;
                        local_488 = 0;
                        local_498 = output;
                        (*(code *)in_FS_OFFSET[-0x85])(lVar13 + -0x430,3);
                        local_4b0 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                        ;
                        pcStack_4a8 = "stbi__hdr_load";
                        local_4a0 = 0x2af2;
                        uStack_4c0 = 0;
                        local_4b8 = 0;
                        local_4c8 = psVar11;
                        (*(code *)in_FS_OFFSET[-0x85])(lVar13 + -0x430,3);
                        pcVar8 = "invalid decoded scanline length";
LAB_001606d4:
                        in_FS_OFFSET[-0x81] = (long)pcVar8;
                        return (float *)0x0;
                      }
                      if ((psVar11 == (stbi_uc *)0x0) &&
                         (psVar11 = (stbi_uc *)stbi__malloc_mad2(a,4,0), psVar11 == (stbi_uc *)0x0))
                      {
                        local_4e0 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                        ;
                        pcStack_4d8 = "stbi__hdr_load";
                        local_4d0 = 0x2af6;
                        uStack_4f0 = 0;
                        local_4e8 = 0;
                        local_4f8 = output;
                        (*(code *)in_FS_OFFSET[-0x85])(*in_FS_OFFSET + -0x430,3);
                        goto LAB_00160970;
                      }
                      local_620 = 0;
                      local_628 = psVar11;
                      do {
                        if (0 < (int)a) {
                          iVar15 = 0;
                          uVar9 = uVar10 & 0xffffffff;
                          do {
                            bVar5 = stbi__get8(s);
                            psVar16 = local_628;
                            uVar14 = (uint)bVar5;
                            if (bVar5 < 0x81) {
                              if ((uint)uVar9 < uVar14) {
                                lVar13 = *in_FS_OFFSET + -0x430;
                                local_570 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                                ;
                                pcStack_568 = "stbi__hdr_load";
                                local_560 = 0x2b09;
                                uStack_580 = 0;
                                local_578 = 0;
                                local_588 = output;
                                (*(code *)in_FS_OFFSET[-0x85])(lVar13,3);
                                local_5a0 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                                ;
                                pcStack_598 = "stbi__hdr_load";
                                local_590 = 0x2b09;
                                uStack_5b0 = 0;
                                local_5a8 = 0;
                                local_5b8 = psVar11;
                                goto LAB_001606b9;
                              }
                              if (uVar14 != 0) {
                                lVar13 = 0;
                                do {
                                  sVar2 = stbi__get8(s);
                                  psVar16[lVar13 * 4 + (long)iVar15 * 4] = sVar2;
                                  lVar13 = lVar13 + 1;
                                } while (uVar14 != (uint)lVar13);
                                iVar15 = iVar15 + (uint)lVar13;
                              }
                            }
                            else {
                              sVar2 = stbi__get8(s);
                              if ((uint)uVar9 < (uVar14 & 0x7f)) {
                                lVar13 = *in_FS_OFFSET + -0x430;
                                local_510 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                                ;
                                pcStack_508 = "stbi__hdr_load";
                                local_500 = 0x2b04;
                                uStack_520 = 0;
                                local_518 = 0;
                                local_528 = output;
                                (*(code *)in_FS_OFFSET[-0x85])(lVar13,3);
                                local_540 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                                ;
                                pcStack_538 = "stbi__hdr_load";
                                local_530 = 0x2b04;
                                uStack_550 = 0;
                                local_548 = 0;
                                local_558 = psVar11;
LAB_001606b9:
                                (*(code *)in_FS_OFFSET[-0x85])(lVar13,3);
                                pcVar8 = "corrupt";
                                goto LAB_001606d4;
                              }
                              if ((bVar5 & 0x7f) != 0) {
                                lVar13 = 0;
                                do {
                                  local_628[lVar13 * 4 + (long)iVar15 * 4] = sVar2;
                                  lVar13 = lVar13 + 1;
                                } while ((uVar14 & 0x7f) != (uint)lVar13);
                                iVar15 = iVar15 + (uint)lVar13;
                              }
                            }
                            uVar9 = (ulong)(a - iVar15);
                          } while (a - iVar15 != 0 && iVar15 <= (int)a);
                        }
                        local_620 = local_620 + 1;
                        local_628 = local_628 + 1;
                      } while (local_620 != 4);
                      local_620 = 4;
                      uVar9 = local_618;
                      output_00 = local_630;
                      psVar16 = psVar11;
                      if (0 < (int)a) {
                        do {
                          stbi__hdr_convert(output_00,psVar16,c);
                          output_00 = (float *)((long)output_00 + local_5f8);
                          psVar16 = psVar16 + 4;
                          uVar9 = uVar9 - 1;
                        } while (uVar9 != 0);
                      }
                      uVar9 = local_600 + 1;
                      local_630 = (float *)((long)local_630 + local_608);
                    } while (uVar9 != local_610);
                  }
                  if (psVar11 == (stbi_uc *)0x0) {
                    return output;
                  }
                  local_5d0 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                  ;
                  pcStack_5c8 = "stbi__hdr_load";
                  local_5c0 = 0x2b13;
                  uStack_5e0 = 0;
                  local_5d8 = 0;
                  local_5e8 = psVar11;
                  (*(code *)in_FS_OFFSET[-0x85])(*in_FS_OFFSET + -0x430,3);
                  return output;
                }
LAB_00160970:
                pcVar8 = "outofmem";
                goto LAB_0016011a;
              }
            }
            pcVar8 = "too large";
            goto LAB_0016011a;
          }
        }
        pcVar8 = "unsupported data layout";
        goto LAB_0016011a;
      }
    }
    pcVar8 = "unsupported format";
  }
  else {
    pcVar8 = "not HDR";
  }
LAB_0016011a:
  in_FS_OFFSET[-0x81] = (long)pcVar8;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}